

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::LeaveIdleDecommit(Recycler *this)

{
  HANDLE pVVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  IdleDecommitSignal IVar5;
  int iVar6;
  undefined8 *in_FS_OFFSET;
  
  pVVar1 = this->concurrentIdleDecommitEvent;
  IVar5 = HeapInfoManager::LeaveIdleDecommit(&this->autoHeap,pVVar1 != (HANDLE)0x0);
  if (IVar5 == IdleDecommitSignal_None) {
    return;
  }
  if (pVVar1 == (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x439,"(allowTimer)","allowTimer");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  if (IVar5 != IdleDecommitSignal_NeedSignal) {
    LOCK();
    iVar6 = this->needIdleDecommitSignal;
    if (iVar6 == 0) {
      this->needIdleDecommitSignal = 1;
      iVar6 = 0;
    }
    UNLOCK();
    if (iVar6 != 2) {
      return;
    }
  }
  bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,IdleDecommitPhase);
  if (bVar4) {
    Output::Print(L"Recycler Thread IdleDecommit Need Signal\n");
    Output::Flush();
  }
  SetEvent(this->concurrentIdleDecommitEvent);
  return;
}

Assistant:

void
Recycler::LeaveIdleDecommit()
{
#ifdef IDLE_DECOMMIT_ENABLED
    bool allowTimer = (this->concurrentIdleDecommitEvent != nullptr);
    IdleDecommitSignal idleDecommitSignal = autoHeap.LeaveIdleDecommit(allowTimer);

    if (idleDecommitSignal != IdleDecommitSignal_None)
    {
        Assert(allowTimer);
        // Reduce the number of times we need to signal the background thread
        // by detecting whether the thread is waiting on a time out or not
        if (idleDecommitSignal == IdleDecommitSignal_NeedSignal ||
            ::InterlockedCompareExchange(&needIdleDecommitSignal, IdleDecommitSignal_NeedTimer, IdleDecommitSignal_None) == IdleDecommitSignal_NeedSignal)
        {
#if DBG
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::IdleDecommitPhase))
            {
                Output::Print(_u("Recycler Thread IdleDecommit Need Signal\n"));
                Output::Flush();
            }
#endif

#pragma prefast(suppress:6387, "INVALID_PARAM_VALUE_1 We will never reach here if concurrentIdleDecommitEvent is NULL.");
            SetEvent(this->concurrentIdleDecommitEvent);
        }
    }

#else
    autoHeap.LeaveIdleDecommit(false /*allowTimer*/);
#endif
}